

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall embree::TutorialApplication::~TutorialApplication(TutorialApplication *this)

{
  unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *this_00;
  ISPCScene *__ptr_00;
  _Head_base<0UL,_embree::ISPCScene_*,_false> __ptr_01;
  pointer pcVar1;
  PerspectiveCameraNode *pPVar2;
  pointer *__ptr;
  
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__TutorialApplication_002c60f0;
  g_ispc_scene = (ISPCScene *)0x0;
  this_00 = &this->ispc_scene;
  __ptr_00 = (this->ispc_scene)._M_t.
             super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
             super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
             super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl;
  (this->ispc_scene)._M_t.
  super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
  super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
  super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl = (ISPCScene *)0x0;
  if (__ptr_00 != (ISPCScene *)0x0) {
    std::default_delete<embree::ISPCScene>::operator()
              ((default_delete<embree::ISPCScene> *)this_00,__ptr_00);
  }
  device_cleanup();
  if (g_device != (RTCDevice)0x0) {
    rtcReleaseDevice();
  }
  alignedUSMFree(this->pixels);
  this->width = 0;
  this->height = 0;
  this->pixels = (uint *)0x0;
  alignedFree(g_stats);
  g_stats = (RayStats *)0x0;
  __ptr_01._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
       super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
       super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl;
  if (__ptr_01._M_head_impl != (ISPCScene *)0x0) {
    std::default_delete<embree::ISPCScene>::operator()
              ((default_delete<embree::ISPCScene> *)this_00,__ptr_01._M_head_impl);
  }
  (this->ispc_scene)._M_t.
  super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>._M_t.
  super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>.
  super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl = (ISPCScene *)0x0;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                *)&this->avg_mrayps);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                *)&this->avg_frame_time);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                *)&this->avg_render_time);
  pcVar1 = (this->referenceImageFilename).filename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->referenceImageFilename).filename.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->outputImageFilename).filename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->outputImageFilename).filename.field_2) {
    operator_delete(pcVar1);
  }
  pPVar2 = (this->animated_camera).ptr;
  if (pPVar2 != (PerspectiveCameraNode *)0x0) {
    (*(pPVar2->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pcVar1 = (this->tutorialName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->tutorialName).field_2) {
    operator_delete(pcVar1);
  }
  Application::~Application(&this->super_Application);
  return;
}

Assistant:

TutorialApplication::~TutorialApplication()
  {
    g_ispc_scene = nullptr;
    ispc_scene = nullptr;
    device_cleanup();
    if (g_device) rtcReleaseDevice(g_device);
    alignedUSMFree(pixels);
    pixels = nullptr;

#if defined(EMBREE_SYCL_SUPPORT)
    delete device; device = nullptr;
    delete queue; queue = nullptr;
    delete context; context = nullptr;
#endif
    
    width = 0;
    height = 0;
    alignedFree(g_stats);
    g_stats = nullptr;

#if defined(EMBREE_SYCL_SUPPORT)
    
    if (features & FEATURE_SYCL)
      disableUSMAllocTutorial();

#endif
  }